

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndexedStateQueryTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::SampleMaskCase::iterate(SampleMaskCase *this)

{
  size_type *psVar1;
  ostringstream *poVar2;
  uint uVar3;
  QueryType QVar4;
  RenderContext *context;
  int iVar5;
  deUint32 dVar6;
  int iVar7;
  long *plVar8;
  undefined8 *puVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ObjectTraits *traits;
  TestLog *pTVar11;
  uint numBits;
  ulong *puVar12;
  Surface *pSVar13;
  char *pcVar14;
  int iVar15;
  void *__buf;
  void *__buf_00;
  char *description;
  IterateResult IVar16;
  undefined4 uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  ulong uVar22;
  bool bVar23;
  vector<unsigned_int,_std::allocator<unsigned_int>_> totalBitmask;
  Surface errorMask;
  Surface result;
  ScopedLogSection section;
  Buffer vertexBuffer;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bitmask;
  vector<unsigned_int,_std::allocator<unsigned_int>_> effectiveMask;
  string local_4c8;
  Surface local_4a8;
  Surface local_490;
  long *local_478;
  undefined8 local_470;
  long local_468;
  undefined8 uStack_460;
  ulong *local_458;
  long local_450;
  ulong local_448;
  long lStack_440;
  ulong *local_438;
  long local_430;
  ulong local_428;
  long lStack_420;
  ScopedLogSection local_418;
  LogImage local_410;
  ulong *local_380;
  long local_378;
  ulong local_370 [2];
  ulong *local_360;
  long local_358;
  ulong local_350 [2];
  LogImage local_340;
  string local_2b0;
  LogImageSet local_290;
  string local_250;
  undefined1 *local_230;
  undefined8 local_228;
  undefined1 local_220;
  undefined7 uStack_21f;
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [112];
  ios_base local_140 [8];
  ios_base local_138 [264];
  long lVar10;
  
  pTVar11 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_410.m_name._M_dataplus._M_p = (pointer)&local_410.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"Iteration","");
  iVar5 = *(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4);
  if (iVar5 == -1) {
    local_340.m_name._M_dataplus._M_p = (pointer)&local_340.m_name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_340,"Verifying with zero mask","");
    goto LAB_01553c62;
  }
  local_230 = &local_220;
  local_228 = 0;
  local_220 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_230);
  puVar12 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar12) {
    local_448 = *puVar12;
    lStack_440 = plVar8[3];
    local_458 = &local_448;
  }
  else {
    local_448 = *puVar12;
    local_458 = (ulong *)*plVar8;
  }
  local_450 = plVar8[1];
  *plVar8 = (long)puVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  iVar7 = *(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,iVar7 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base(local_140);
  uVar22 = 0xf;
  if (local_458 != &local_448) {
    uVar22 = local_448;
  }
  if (uVar22 < (ulong)(local_358 + local_450)) {
    uVar22 = 0xf;
    if (local_360 != local_350) {
      uVar22 = local_350[0];
    }
    if (uVar22 < (ulong)(local_358 + local_450)) goto LAB_01553a71;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_360,0,(char *)0x0,(ulong)local_458);
  }
  else {
LAB_01553a71:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_458,(ulong)local_360);
  }
  local_478 = &local_468;
  plVar8 = puVar9 + 2;
  if ((long *)*puVar9 == plVar8) {
    local_468 = *plVar8;
    uStack_460 = puVar9[3];
  }
  else {
    local_468 = *plVar8;
    local_478 = (long *)*puVar9;
  }
  local_470 = puVar9[1];
  *puVar9 = plVar8;
  puVar9[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_478);
  puVar12 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar12) {
    local_428 = *puVar12;
    lStack_420 = plVar8[3];
    local_438 = &local_428;
  }
  else {
    local_428 = *puVar12;
    local_438 = (ulong *)*plVar8;
  }
  local_430 = plVar8[1];
  *plVar8 = (long)puVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,this->m_verifierType);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base(local_140);
  uVar22 = 0xf;
  if (local_438 != &local_428) {
    uVar22 = local_428;
  }
  if (uVar22 < (ulong)(local_378 + local_430)) {
    uVar22 = 0xf;
    if (local_380 != local_370) {
      uVar22 = local_370[0];
    }
    if (uVar22 < (ulong)(local_378 + local_430)) goto LAB_01553be7;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_380,0,(char *)0x0,(ulong)local_438);
  }
  else {
LAB_01553be7:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_438,(ulong)local_380);
  }
  local_340.m_name._M_dataplus._M_p = (pointer)&local_340.m_name.field_2;
  psVar1 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_340.m_name.field_2._M_allocated_capacity = *psVar1;
    local_340.m_name.field_2._8_8_ = puVar9[3];
  }
  else {
    local_340.m_name.field_2._M_allocated_capacity = *psVar1;
    local_340.m_name._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_340.m_name._M_string_length = puVar9[1];
  *puVar9 = psVar1;
  puVar9[1] = 0;
  *(undefined1 *)psVar1 = 0;
LAB_01553c62:
  tcu::ScopedLogSection::ScopedLogSection(&local_418,pTVar11,&local_410.m_name,&local_340.m_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340.m_name._M_dataplus._M_p != &local_340.m_name.field_2) {
    operator_delete(local_340.m_name._M_dataplus._M_p,
                    local_340.m_name.field_2._M_allocated_capacity + 1);
  }
  if (iVar5 != -1) {
    if (local_380 != local_370) {
      operator_delete(local_380,local_370[0] + 1);
    }
    if (local_438 != &local_428) {
      operator_delete(local_438,local_428 + 1);
    }
    if (local_478 != &local_468) {
      operator_delete(local_478,local_468 + 1);
    }
    if (local_360 != local_350) {
      operator_delete(local_360,local_350[0] + 1);
    }
    if (iVar5 != -1) {
      if (local_458 != &local_448) {
        operator_delete(local_458,local_448 + 1);
      }
      if (local_230 != &local_220) {
        operator_delete(local_230,CONCAT71(uStack_21f,local_220) + 1);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410.m_name._M_dataplus._M_p != &local_410.m_name.field_2) {
    operator_delete(local_410.m_name._M_dataplus._M_p,
                    CONCAT44(local_410.m_name.field_2._M_allocated_capacity._4_4_,
                             local_410.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  uVar3 = *(uint *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4);
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar5);
  (**(code **)(lVar10 + 0x78))
            (0x8d40,*(undefined4 *)
                     &this[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2);
  iVar5 = this->m_maxSampleMaskWords;
  (**(code **)(lVar10 + 0x1a00))(0,0,iVar5);
  (**(code **)(lVar10 + 0x1c0))(0,0,0,0x3f800000);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Clearing image",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  (**(code **)(lVar10 + 0x188))(0x4000);
  if (((ulong)this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx & 4) == 0) {
    genSetNthBitSampleMask((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_340,uVar3);
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"Setting sample mask to 0b",0x19);
    Functional::(anonymous_namespace)::sampleMaskToString_abi_cxx11_
              (&local_410.m_name,(_anonymous_namespace_ *)&local_340,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)this->m_verifierType,
               iVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,local_410.m_name._M_dataplus._M_p,local_410.m_name._M_string_length
              );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410.m_name._M_dataplus._M_p != &local_410.m_name.field_2) {
      operator_delete(local_410.m_name._M_dataplus._M_p,
                      CONCAT44(local_410.m_name.field_2._M_allocated_capacity._4_4_,
                               local_410.m_name.field_2._M_allocated_capacity._0_4_) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_138);
    (**(code **)(lVar10 + 0x5e0))(0x8e51);
    if (0 < *(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       ) {
      uVar22 = 0;
      do {
        uVar17 = 0;
        if ((long)uVar22 <
            (long)(int)(local_340.m_name._M_string_length - (long)local_340.m_name._M_dataplus._M_p
                       >> 2)) {
          uVar17 = *(undefined4 *)(local_340.m_name._M_dataplus._M_p + uVar22 * 4);
        }
        (**(code **)(lVar10 + 0x1258))(uVar22 & 0xffffffff,uVar17);
        uVar22 = uVar22 + 1;
      } while ((long)uVar22 <
               (long)*(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.
                                     _vptr_TestNode + 4));
    }
  }
  else {
    genSetNthBitSampleMask((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_340,uVar3);
    QVar4 = this->m_verifierType;
    iVar5 = QVar4 - QUERY_BOOLEAN_VEC4;
    iVar7 = QVar4 + QUERY_TEXTURE_LEVEL_FLOAT;
    if (-1 < iVar5) {
      iVar7 = iVar5;
    }
    iVar7 = iVar7 >> 5;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_290,(long)(iVar7 + 1),
               (allocator_type *)local_1b0);
    if (0x1f < iVar5) {
      memset(local_290.m_name._M_dataplus._M_p,0xff,(ulong)(iVar7 - 1) * 4 + 4);
    }
    *(uint *)(local_290.m_name._M_dataplus._M_p + (long)iVar7 * 4) =
         ~(uint)(-1L << ((char)QVar4 - (char)(iVar7 << 5) & 0x3fU));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_4c8,
               (long)(local_290.m_name._M_string_length - (long)local_290.m_name._M_dataplus._M_p)
               >> 2,(allocator_type *)local_1b0);
    numBits = (uint)(local_290.m_name._M_string_length - (long)local_290.m_name._M_dataplus._M_p >>
                    2);
    if (0 < (int)numBits) {
      numBits = numBits & 0x7fffffff;
      uVar18 = 0;
      uVar22 = 0;
      do {
        uVar19 = 0;
        if ((long)uVar22 <
            (long)(int)(local_340.m_name._M_string_length - (long)local_340.m_name._M_dataplus._M_p
                       >> 2)) {
          uVar19 = *(uint *)(local_340.m_name._M_dataplus._M_p + uVar22 * 4);
        }
        uVar20 = ((uVar18 ^ uVar3) >> 0x10 ^ uVar18 ^ uVar3 ^ 0x3d) * 9;
        uVar20 = (uVar20 >> 4 ^ uVar20) * 0x27d4eb2d;
        uVar20 = uVar20 >> 0xf ^ uVar20;
        *(uint *)(local_4c8._M_dataplus._M_p + uVar22 * 4) =
             (uVar19 ^ uVar20) & *(uint *)(local_290.m_name._M_dataplus._M_p + uVar22 * 4) ^ uVar20;
        uVar22 = uVar22 + 1;
        uVar18 = uVar18 + 4;
      } while (numBits != uVar22);
    }
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"Setting sample mask to 0b",0x19);
    Functional::(anonymous_namespace)::sampleMaskToString_abi_cxx11_
              (&local_410.m_name,(_anonymous_namespace_ *)&local_4c8,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               (ulong)(((int)local_4c8._M_string_length - (int)local_4c8._M_dataplus._M_p &
                       0x1ffffffcU) << 3),numBits);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,local_410.m_name._M_dataplus._M_p,local_410.m_name._M_string_length
              );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410.m_name._M_dataplus._M_p != &local_410.m_name.field_2) {
      operator_delete(local_410.m_name._M_dataplus._M_p,
                      CONCAT44(local_410.m_name.field_2._M_allocated_capacity._4_4_,
                               local_410.m_name.field_2._M_allocated_capacity._0_4_) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_138);
    (**(code **)(lVar10 + 0x5e0))(0x8e51);
    if (0 < *(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       ) {
      uVar22 = 0;
      do {
        uVar17 = 0;
        if ((long)uVar22 <
            (long)(int)(local_4c8._M_string_length - (long)local_4c8._M_dataplus._M_p >> 2)) {
          uVar17 = *(undefined4 *)(local_4c8._M_dataplus._M_p + uVar22 * 4);
        }
        (**(code **)(lVar10 + 0x1258))(uVar22 & 0xffffffff,uVar17);
        uVar22 = uVar22 + 1;
      } while ((long)uVar22 <
               (long)*(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.
                                     _vptr_TestNode + 4));
    }
    if (local_4c8._M_dataplus._M_p != (char *)0x0) {
      operator_delete(local_4c8._M_dataplus._M_p,
                      local_4c8.field_2._M_allocated_capacity - (long)local_4c8._M_dataplus._M_p);
    }
    if (local_290.m_name._M_dataplus._M_p != (char *)0x0) {
      operator_delete(local_290.m_name._M_dataplus._M_p,
                      local_290.m_name.field_2._M_allocated_capacity -
                      (long)local_290.m_name._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340.m_name._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_340.m_name._M_dataplus._M_p,
                    local_340.m_name.field_2._M_allocated_capacity -
                    (long)local_340.m_name._M_dataplus._M_p);
  }
  if (((ulong)this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx & 1) != 0) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"Enabling alpha to coverage.",0x1b);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_138);
    (**(code **)(lVar10 + 0x5e0))(0x809e);
  }
  if (((ulong)this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx & 2) != 0) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"Enabling sample coverage. Varying sample coverage for grid cells."
               ,0x41);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_138);
    (**(code **)(lVar10 + 0x5e0))(0x80a0);
  }
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Drawing test grid",0x11);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  (**(code **)(lVar10 + 0xd8))
            ((int)this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length);
  (**(code **)(lVar10 + 0x40))
            (0x8892,*(undefined4 *)
                     ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name.
                             _M_string_length + 4));
  (**(code **)(lVar10 + 0x19f0))
            (*(undefined4 *)
              ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description.field_2 + 8
              ),4,0x1406,0,0,0);
  (**(code **)(lVar10 + 0x610))
            (*(undefined4 *)
              ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description.field_2 + 8
              ));
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"vertexAttribPointer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x398);
  (**(code **)(lVar10 + 0x1680))
            (*(undefined4 *)
              (this[1].super_TestCase.super_TestCase.super_TestNode.m_description.field_2.
               _M_allocated_capacity + 0x98));
  if (0 < *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode) {
    iVar5 = 0;
    do {
      iVar7 = *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode;
      if (0 < iVar7) {
        iVar21 = 0;
        do {
          if (((ulong)this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx & 2) != 0) {
            (**(code **)(lVar10 + 0x1250))
                      ((float)(iVar5 * iVar7 + iVar21) / (float)(iVar7 * iVar7),0);
          }
          (**(code **)(lVar10 + 0x538))
                    (4,(*(int *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
                        * iVar5 + iVar21) * 6,6);
          dVar6 = (**(code **)(lVar10 + 0x800))();
          glu::checkError(dVar6,"drawArrays",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                          ,0x3a3);
          iVar21 = iVar21 + 1;
          iVar7 = *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode;
        } while (iVar21 < iVar7);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode);
  }
  (**(code **)(lVar10 + 0x518))
            (*(undefined4 *)
              ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description.field_2 + 8
              ));
  (**(code **)(lVar10 + 0x1680))(0);
  (**(code **)(lVar10 + 0x78))(0x8d40,0);
  (**(code **)(lVar10 + 0x4e8))(0x8e51);
  (**(code **)(lVar10 + 0x4e8))(0x809e);
  (**(code **)(lVar10 + 0x4e8))(0x80a0);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"clean",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x3ae);
  iVar5 = *(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4);
  tcu::Surface::Surface(&local_490,this->m_maxSampleMaskWords,this->m_maxSampleMaskWords);
  tcu::Surface::Surface(&local_4a8,this->m_maxSampleMaskWords,this->m_maxSampleMaskWords);
  local_410.m_name._M_dataplus._M_p = (pointer)0x300000008;
  if ((void *)local_4a8.m_pixels.m_cap != (void *)0x0) {
    local_4a8.m_pixels.m_cap = (size_t)local_4a8.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_410,local_4a8.m_width,
             local_4a8.m_height,1,(void *)local_4a8.m_pixels.m_cap);
  local_340.m_name._M_dataplus._M_p._0_4_ = 0xff00ff00;
  tcu::RGBA::toVec((RGBA *)&local_410);
  tcu::clear((PixelBufferAccess *)local_1b0,(Vec4 *)&local_410);
  if (Functional::(anonymous_namespace)::SampleMaskCase::drawSample(tcu::Surface&,int)::
      fullscreenQuad == '\0') {
    _GLOBAL__N_1::SampleMaskCase::iterate();
  }
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var_00,iVar7);
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper
            ((ObjectWrapper *)&local_410,(Functions *)CONCAT44(extraout_var_01,iVar7),traits);
  (**(code **)(lVar10 + 0xb8))
            (0x9100,*(undefined4 *)
                     ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus
                             ._M_p + 4));
  (**(code **)(lVar10 + 0xd8))
            ((int)this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length);
  (**(code **)(lVar10 + 0x40))(0x8892,local_410.m_name.field_2._M_allocated_capacity._0_4_);
  (**(code **)(lVar10 + 0x150))
            (0x8892,0x40,
             Functional::(anonymous_namespace)::SampleMaskCase::drawSample(tcu::Surface&,int)::
             fullscreenQuad,0x88e4);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"bufferData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x3f9);
  (**(code **)(lVar10 + 0x1a00))(0,0,this->m_maxSampleMaskWords);
  (**(code **)(lVar10 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar10 + 0x188))(0x4000);
  (**(code **)(lVar10 + 0x19f0))
            (*(undefined4 *)
              &this[1].super_TestCase.super_TestCase.super_TestNode.m_description._M_dataplus._M_p,4
             ,0x1406,0,0,0);
  (**(code **)(lVar10 + 0x610))
            (*(undefined4 *)
              &this[1].super_TestCase.super_TestCase.super_TestNode.m_description._M_dataplus._M_p);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"vertexAttribPointer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x400);
  (**(code **)(lVar10 + 0x1680))
            (*(undefined4 *)
              (*(long *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2
                        + 8) + 0x98));
  (**(code **)(lVar10 + 0x14f0))
            (*(undefined4 *)
              ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description._M_dataplus
                      ._M_p + 4),0);
  (**(code **)(lVar10 + 0x14f0))
            ((int)this[1].super_TestCase.super_TestCase.super_TestNode.m_description.
                  _M_string_length,iVar5);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"useprogram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x405);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"Reading from texture with sampler shader, u_sample = ",0x35);
  std::ostream::operator<<(poVar2,iVar5);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  (**(code **)(lVar10 + 0x538))(5,0,4);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"drawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x40a);
  (**(code **)(lVar10 + 0x518))
            (*(undefined4 *)
              &this[1].super_TestCase.super_TestCase.super_TestNode.m_description._M_dataplus._M_p);
  (**(code **)(lVar10 + 0x1680))(0);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"cleanup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x40e);
  (**(code **)(lVar10 + 0x648))();
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_340.m_name._M_dataplus._M_p = (pointer)0x300000008;
  if ((void *)local_490.m_pixels.m_cap != (void *)0x0) {
    local_490.m_pixels.m_cap = (size_t)local_490.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_340,local_490.m_width,
             local_490.m_height,1,(void *)local_490.m_pixels.m_cap);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_1b0);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"readPixels",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x412);
  glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)&local_410);
  iVar21 = 0;
  iVar7 = iVar21;
  if (0 < this->m_maxSampleMaskWords) {
    iVar7 = 0;
    do {
      if (0 < this->m_maxSampleMaskWords) {
        iVar15 = 0;
        do {
          uVar3 = *(uint *)((long)local_490.m_pixels.m_ptr +
                           (long)(local_490.m_width * iVar21 + iVar15) * 4);
          if (((uVar3 & 0xff00) != 0) ||
             ((((char)uVar3 != -1 && (iVar5 != -1)) &&
              (((ulong)this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx & 3) == 0))))
          {
            *(undefined4 *)
             ((long)local_4a8.m_pixels.m_ptr + (long)(local_4a8.m_width * iVar21 + iVar15) * 4) =
                 0xff0000ff;
            iVar7 = 1;
          }
          iVar15 = iVar15 + 1;
        } while (iVar15 < this->m_maxSampleMaskWords);
      }
      iVar21 = iVar21 + 1;
    } while (iVar21 < this->m_maxSampleMaskWords);
  }
  if (iVar7 == 0) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),"Image verification ok, no disabled samples found.",0x31);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),"Image verification failed, disabled samples found.",0x32)
    ;
    pTVar11 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
    local_410.m_name._M_dataplus._M_p = (pointer)0x12;
    local_4c8._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_4c8,(ulong)&local_410);
    local_4c8.field_2._M_allocated_capacity = (size_type)local_410.m_name._M_dataplus._M_p;
    builtin_strncpy(local_4c8._M_dataplus._M_p,"VerificationResult",0x12);
    local_4c8._M_string_length = (size_type)local_410.m_name._M_dataplus._M_p;
    local_4c8._M_dataplus._M_p[(long)local_410.m_name._M_dataplus._M_p] = '\0';
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    local_410.m_name._M_dataplus._M_p = (pointer)0x13;
    local_2b0._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_2b0,(ulong)&local_410);
    local_2b0.field_2._M_allocated_capacity = (size_type)local_410.m_name._M_dataplus._M_p;
    builtin_strncpy(local_2b0._M_dataplus._M_p,"Result of rendering",0x13);
    local_2b0._M_string_length = (size_type)local_410.m_name._M_dataplus._M_p;
    local_2b0._M_dataplus._M_p[(long)local_410.m_name._M_dataplus._M_p] = '\0';
    tcu::LogImageSet::LogImageSet(&local_290,&local_4c8,&local_2b0);
    tcu::TestLog::startImageSet
              (pTVar11,local_290.m_name._M_dataplus._M_p,local_290.m_description._M_dataplus._M_p);
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    local_250.field_2._M_allocated_capacity._0_4_ = 0x75736552;
    local_250.field_2._M_allocated_capacity._4_2_ = 0x746c;
    local_250._M_string_length = 6;
    local_250.field_2._M_local_buf[6] = '\0';
    local_1d0.field_2._M_allocated_capacity._0_4_ = 0x75736552;
    local_1d0.field_2._M_allocated_capacity._4_2_ = 0x746c;
    local_1d0._M_string_length = 6;
    local_1d0.field_2._M_local_buf[6] = '\0';
    pSVar13 = &local_490;
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    tcu::LogImage::LogImage(&local_410,&local_250,&local_1d0,pSVar13,QP_IMAGE_COMPRESSION_MODE_BEST)
    ;
    tcu::LogImage::write(&local_410,(int)pTVar11,__buf,(size_t)pSVar13);
    local_1f0.field_2._M_allocated_capacity = 0x73614d726f727245;
    local_1f0.field_2._8_2_ = 0x6b;
    local_1f0._M_string_length = 9;
    local_210.field_2._M_allocated_capacity = 0x614d20726f727245;
    local_210.field_2._8_2_ = 0x6b73;
    local_210._M_string_length = 10;
    local_210.field_2._M_local_buf[10] = '\0';
    pSVar13 = &local_4a8;
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    tcu::LogImage::LogImage(&local_340,&local_1f0,&local_210,pSVar13,QP_IMAGE_COMPRESSION_MODE_BEST)
    ;
    tcu::LogImage::write(&local_340,(int)pTVar11,__buf_00,(size_t)pSVar13);
    tcu::TestLog::endImageSet(pTVar11);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340.m_description._M_dataplus._M_p != &local_340.m_description.field_2) {
      operator_delete(local_340.m_description._M_dataplus._M_p,
                      local_340.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340.m_name._M_dataplus._M_p != &local_340.m_name.field_2) {
      operator_delete(local_340.m_name._M_dataplus._M_p,
                      local_340.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410.m_description._M_dataplus._M_p != &local_410.m_description.field_2) {
      operator_delete(local_410.m_description._M_dataplus._M_p,
                      local_410.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410.m_name._M_dataplus._M_p != &local_410.m_name.field_2) {
      operator_delete(local_410.m_name._M_dataplus._M_p,
                      CONCAT44(local_410.m_name.field_2._M_allocated_capacity._4_4_,
                               local_410.m_name.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,
                      CONCAT17(local_1d0.field_2._M_local_buf[7],
                               CONCAT16(local_1d0.field_2._M_local_buf[6],
                                        CONCAT24(local_1d0.field_2._M_allocated_capacity._4_2_,
                                                 local_1d0.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,
                      CONCAT17(local_250.field_2._M_local_buf[7],
                               CONCAT16(local_250.field_2._M_local_buf[6],
                                        CONCAT24(local_250.field_2._M_allocated_capacity._4_2_,
                                                 local_250.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290.m_description._M_dataplus._M_p != &local_290.m_description.field_2) {
      operator_delete(local_290.m_description._M_dataplus._M_p,
                      local_290.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290.m_name._M_dataplus._M_p != &local_290.m_name.field_2) {
      operator_delete(local_290.m_name._M_dataplus._M_p,
                      local_290.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,
                      (ulong)(local_2b0.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
      operator_delete(local_4c8._M_dataplus._M_p,
                      (ulong)(local_4c8.field_2._M_allocated_capacity + 1));
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base(local_138);
  tcu::Surface::~Surface(&local_4a8);
  tcu::Surface::~Surface(&local_490);
  if (iVar7 != 0) {
    *(undefined4 *)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p = 0
    ;
  }
  iVar5 = *(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) + 1;
  *(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = iVar5;
  IVar16 = CONTINUE;
  if ((int)this->m_verifierType <= iVar5) {
    pcVar14 = "Unused mask bits have effect";
    if (((ulong)this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx & 4) == 0) {
      pcVar14 = "Sample test failed";
    }
    bVar23 = *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p
             == 0;
    description = "Pass";
    if (bVar23) {
      description = pcVar14;
    }
    IVar16 = STOP;
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar23,
               description);
  }
  tcu::TestLog::endSection(local_418.m_log);
  return IVar16;
}

Assistant:

SampleMaskCase::IterateResult SampleMaskCase::iterate (void)
{
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	// initial values
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "initial", "Initial values");

		for (int ndx = 0; ndx < m_maxSampleMaskWords; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_SAMPLE_MASK_VALUE, ndx, -1, m_verifierType);
	}

	// fixed values
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "fixed", "Fixed values");

		for (int ndx = 0; ndx < m_maxSampleMaskWords; ++ndx)
		{
			gl.glSampleMaski(ndx, 0);
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "glSampleMaski");

			verifyStateIndexedInteger(result, gl, GL_SAMPLE_MASK_VALUE, ndx, 0, m_verifierType);
		}
	}

	// random masks
	{
		const int					numRandomTest	= 20;
		const tcu::ScopedLogSection section			(m_testCtx.getLog(), "random", "Random values");
		de::Random					rnd				(0x4312);

		for (int testNdx = 0; testNdx < numRandomTest; ++testNdx)
		{
			const glw::GLint	maskIndex		= (glw::GLint)(rnd.getUint32() % m_maxSampleMaskWords);
			glw::GLint			mask			= (glw::GLint)(rnd.getUint32());

			gl.glSampleMaski(maskIndex, mask);
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "glSampleMaski");

			verifyStateIndexedInteger(result, gl, GL_SAMPLE_MASK_VALUE, maskIndex, mask, m_verifierType);
		}
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}